

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

bool __thiscall ON_PolylineCurve::ChangeDimension(ON_PolylineCurve *this,int desired_dimension)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  bool local_21;
  int local_1c;
  int count;
  int i;
  bool rc;
  int desired_dimension_local;
  ON_PolylineCurve *this_local;
  
  local_21 = 1 < desired_dimension && desired_dimension < 4;
  if ((1 < desired_dimension && desired_dimension < 4) && (this->m_dim != desired_dimension)) {
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    iVar1 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    if (desired_dimension == 2) {
      if (0 < iVar1) {
        pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
        if ((pOVar2->x != -1.23432101234321e+308) || (NAN(pOVar2->x))) {
          for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
            pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[]
                               ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_1c);
            pOVar2->z = 0.0;
          }
        }
      }
      this->m_dim = 2;
    }
    else {
      if (0 < iVar1) {
        pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
        if ((pOVar2->x != -1.23432101234321e+308) || (NAN(pOVar2->x))) {
          pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[]
                             ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,0);
          if ((pOVar2->z == -1.23432101234321e+308) && (!NAN(pOVar2->z))) {
            for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
              pOVar2 = ON_SimpleArray<ON_3dPoint>::operator[]
                                 ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_1c);
              pOVar2->z = 0.0;
            }
          }
        }
      }
      this->m_dim = 3;
    }
  }
  return local_21;
}

Assistant:

bool ON_PolylineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if ( rc && m_dim != desired_dimension )
  {
  	DestroyCurveTree();
    int i, count = m_pline.Count();
    if ( 2 == desired_dimension )
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If x coord of first point is set, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 2;
    }
    else 
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If first point x coord is set and z is unset, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x && ON_UNSET_VALUE == m_pline[0].z )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 3;
    }
  }

  return rc;
}